

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lws_map.c
# Opt level: O2

lws_map_item_t *
lws_map_item_create(lws_map_t *map,lws_map_key_t key,size_t keylen,lws_map_value_t value,
                   size_t valuelen)

{
  lws_map_hash_t lVar1;
  lws_map_item_t *plVar2;
  
  plVar2 = lws_map_item_lookup(map,key,keylen);
  if (plVar2 != (lws_map_item_t *)0x0) {
    lws_map_item_destroy(plVar2);
  }
  plVar2 = (lws_map_item_t *)(*(map->info)._alloc)(map,keylen + valuelen + 0x28);
  if (plVar2 != (lws_map_item_t *)0x0) {
    lws_dll2_clear((lws_dll2 *)plVar2);
    plVar2->keylen = keylen;
    plVar2->valuelen = valuelen;
    memcpy(plVar2 + 1,key,keylen);
    if (value != (lws_map_value_t)0x0) {
      memcpy((void *)((long)&plVar2[1].list.prev + keylen),value,valuelen);
    }
    lVar1 = (*(map->info)._hash)(key,keylen);
    lws_dll2_add_head((lws_dll2 *)plVar2,
                      (lws_dll2_owner *)
                      (&map[1].info._compare + ((ulong)lVar1 % (map->info).modulo) * 4));
  }
  return plVar2;
}

Assistant:

lws_map_item_t *
lws_map_item_create(lws_map_t *map,
		    const lws_map_key_t key, size_t keylen,
		    const lws_map_value_t value, size_t valuelen)
{
	lws_map_hashtable_t *ht;
	lws_map_item_t *item;
	lws_map_hash_t h;
	size_t hti;
	uint8_t *u;

	item = lws_map_item_lookup(map, key, keylen);
	if (item)
		lws_map_item_destroy(item);

	item = map->info._alloc(map, sizeof(*item) + keylen + valuelen);
	if (!item)
		return NULL;

	lws_dll2_clear(&item->list);
	item->keylen = keylen;
	item->valuelen = valuelen;

	u = (uint8_t *)&item[1];
	memcpy(u, key, keylen);
	u += keylen;
	if (value)
		memcpy(u, value, valuelen);

	h = map->info._hash(key, keylen);

	hti = h % map->info.modulo;
	ht = (lws_map_hashtable_t *)&map[1];

	lws_dll2_add_head(&item->list, &ht[hti].ho);

	return item;
}